

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle.cpp
# Opt level: O1

BeagleResourceList * beagleGetResourceList(void)

{
  ulong *puVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  bool bVar5;
  BeagleResourceList *pBVar6;
  int iVar7;
  long lVar8;
  BeagleResource *pBVar9;
  list<BeagleResource,_std::allocator<BeagleResource>_> *__x;
  int iVar10;
  _List_node_base *p_Var11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  list<BeagleResource,_std::allocator<BeagleResource>_> rList;
  pair<int,_int> local_60;
  _List_node_base *local_58;
  BeagleResourceList *local_50;
  _List_node_base local_48;
  
  if (plugins_abi_cxx11_ ==
      (list<beagle::plugin::Plugin_*,_std::allocator<beagle::plugin::Plugin_*>_> *)0x0) {
    beagleLoadPlugins();
  }
  if (rsrcList == (BeagleResourceList *)0x0) {
    rsrcList = (BeagleResourceList *)malloc(0x10);
    rsrcList->length = 0;
    p_Var11 = (plugins_abi_cxx11_->
              super__List_base<beagle::plugin::Plugin_*,_std::allocator<beagle::plugin::Plugin_*>_>)
              ._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var11 != (_List_node_base *)plugins_abi_cxx11_) {
      do {
        lVar8 = (**(code **)((long)(p_Var11[1]._M_next)->_M_next + 0x18))();
        rsrcList->length = rsrcList->length + *(int *)(lVar8 + 0x10);
        p_Var11 = (((_List_base<beagle::plugin::Plugin_*,_std::allocator<beagle::plugin::Plugin_*>_>
                     *)&p_Var11->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      } while (p_Var11 != (_List_node_base *)plugins_abi_cxx11_);
    }
    pBVar6 = rsrcList;
    pBVar9 = (BeagleResource *)malloc((long)rsrcList->length << 5);
    pBVar6->list = pBVar9;
    local_58 = (plugins_abi_cxx11_->
               super__List_base<beagle::plugin::Plugin_*,_std::allocator<beagle::plugin::Plugin_*>_>
               )._M_impl._M_node.super__List_node_base._M_next;
    if (local_58 != (_List_node_base *)plugins_abi_cxx11_) {
      uVar12 = 0;
      do {
        __x = (list<BeagleResource,_std::allocator<BeagleResource>_> *)
              (**(code **)(*(long *)local_58[1]._M_next + 0x18))();
        std::__cxx11::list<BeagleResource,_std::allocator<BeagleResource>_>::list
                  ((list<BeagleResource,_std::allocator<BeagleResource>_> *)&local_48,__x);
        iVar10 = (int)uVar12;
        if (local_48._M_next != &local_48) {
          lVar8 = uVar12 << 5;
          p_Var11 = local_48._M_next;
          do {
            uVar13 = (uint)uVar12;
            if (iVar10 < 1) {
LAB_00107244:
              local_60.second = uVar13 - iVar10;
              local_60.first = uVar13;
              std::
              _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
              ::_M_emplace_unique<std::pair<int,int>>
                        ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                          *)&ResourceMap,&local_60);
              lVar14 = (long)(int)uVar13;
              uVar13 = uVar13 + 1;
              p_Var2 = p_Var11[1]._M_prev;
              p_Var3 = p_Var11[2]._M_next;
              p_Var4 = p_Var11[2]._M_prev;
              pBVar9 = rsrcList->list + lVar14;
              pBVar9->name = (char *)p_Var11[1]._M_next;
              pBVar9->description = (char *)p_Var2;
              pBVar9->supportFlags = (long)p_Var3;
              pBVar9->requiredFlags = (long)p_Var4;
            }
            else {
              local_50 = rsrcList;
              pBVar9 = rsrcList->list;
              p_Var2 = p_Var11[1]._M_next;
              lVar14 = 0;
              bVar5 = false;
              do {
                iVar7 = strcmp(*(char **)((long)&pBVar9->name + lVar14),(char *)p_Var2);
                if (iVar7 == 0) {
                  if (!bVar5) {
                    local_50->length = local_50->length + -1;
                    bVar5 = true;
                  }
                  puVar1 = (ulong *)((long)&pBVar9->supportFlags + lVar14);
                  *puVar1 = *puVar1 | (ulong)p_Var11[2]._M_next;
                }
                lVar14 = lVar14 + 0x20;
              } while (lVar8 != lVar14);
              if (!bVar5) goto LAB_00107244;
            }
            uVar12 = (ulong)uVar13;
            p_Var11 = p_Var11->_M_next;
          } while (p_Var11 != &local_48);
        }
        p_Var11 = local_48._M_next;
        while (p_Var11 != &local_48) {
          p_Var2 = p_Var11->_M_next;
          operator_delete(p_Var11);
          p_Var11 = p_Var2;
        }
        local_58 = (((_List_base<beagle::plugin::Plugin_*,_std::allocator<beagle::plugin::Plugin_*>_>
                      *)&local_58->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      } while (local_58 != (_List_node_base *)plugins_abi_cxx11_);
    }
  }
  return rsrcList;
}

Assistant:

BeagleResourceList* beagleGetResourceList() {
    // plugins must be loaded before resources
    if (plugins==NULL)
        beagleLoadPlugins();

    if (rsrcList == NULL) {
        // count the total resources across plugins
        rsrcList = (BeagleResourceList*) malloc(sizeof(BeagleResourceList));
        rsrcList->length = 0;
        std::list<beagle::plugin::Plugin*>::iterator plugin_iter = plugins->begin();
        for(; plugin_iter != plugins->end(); plugin_iter++ ){
            rsrcList->length += (*plugin_iter)->getBeagleResources().size();
        }

        // allocate space for a complete list of resources
        rsrcList->list = (BeagleResource*) malloc(sizeof(BeagleResource) * rsrcList->length);

        // copy in resource lists from each plugin
        int rI=0;
        for(plugin_iter = plugins->begin(); plugin_iter != plugins->end(); plugin_iter++ ){
            std::list<BeagleResource> rList = (*plugin_iter)->getBeagleResources();
            std::list<BeagleResource>::iterator r_iter = rList.begin();
            int prev_rI = rI;
            for(; r_iter != rList.end(); r_iter++){
                bool rsrcExists = false;
                for(int i=0; i<prev_rI; i++){
                    if (strcmp(rsrcList->list[i].name, r_iter->name) == 0) {
                        if (!rsrcExists) {
                            rsrcExists = true;
                            rsrcList->length--;
                        }
                        rsrcList->list[i].supportFlags |= r_iter->supportFlags;
                    }
                }

                if (!rsrcExists) {
                    ResourceMap.insert(std::pair<int, int>(rI, (rI - prev_rI)));
                    rsrcList->list[rI++] = *r_iter;
                }
            }
        }
    }
    return rsrcList;
}